

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::output_example(vw *all,example *ec)

{
  byte bVar1;
  shared_data *this;
  code *pcVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  wclass **ppwVar7;
  ostream *poVar8;
  int **ppiVar9;
  ulong uVar10;
  size_t sVar11;
  wclass *pwVar12;
  long in_RSI;
  long *in_RDI;
  wclass cl_1;
  uint i;
  stringstream outputStringStream;
  substring ss_pred;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  wclass *cl;
  wclass *__end2;
  wclass *__begin2;
  v_array<COST_SENSITIVE::wclass> *__range2;
  float min;
  float chosen_loss;
  size_t pred;
  float loss;
  label *ld;
  undefined8 in_stack_fffffffffffffc88;
  namedlabels *in_stack_fffffffffffffc90;
  multi_ex *in_stack_fffffffffffffc98;
  string local_2b8 [36];
  undefined8 local_294;
  undefined8 local_28c;
  uint local_284;
  stringstream local_280 [16];
  ostream local_270;
  undefined8 local_f8;
  namedlabels *in_stack_ffffffffffffff10;
  multi_ex *in_stack_ffffffffffffff18;
  example *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff2f;
  vw *in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [32];
  substring local_a0;
  undefined8 local_90;
  namedlabels *local_88;
  multi_ex *local_80;
  undefined8 local_78;
  int local_6c;
  int *local_68;
  int *local_60;
  v_array<int> *local_58;
  wclass *local_50;
  wclass *local_48;
  wclass *local_40;
  v_array<COST_SENSITIVE::wclass> *local_38;
  float local_30;
  float local_2c;
  ulong local_28;
  float local_1c;
  v_array<COST_SENSITIVE::wclass> *local_18;
  long local_10;
  long *local_8;
  
  local_18 = (v_array<COST_SENSITIVE::wclass> *)(in_RSI + 0x6828);
  local_1c = 0.0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar6 = test_label(in_stack_fffffffffffffc98);
  if (!bVar6) {
    local_28 = (ulong)*(uint *)(local_10 + 0x6850);
    local_2c = 3.4028235e+38;
    local_30 = 3.4028235e+38;
    local_38 = local_18;
    ppwVar7 = v_array<COST_SENSITIVE::wclass>::begin(local_18);
    local_40 = *ppwVar7;
    ppwVar7 = v_array<COST_SENSITIVE::wclass>::end(local_38);
    local_48 = *ppwVar7;
    for (; local_40 != local_48; local_40 = local_40 + 1) {
      local_50 = local_40;
      if (local_40->class_index == local_28) {
        local_2c = local_40->x;
      }
      if (local_40->x < local_30) {
        local_30 = local_40->x;
      }
    }
    if ((local_2c == 3.4028235e+38) && (!NAN(local_2c))) {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?"
                              );
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    local_1c = (local_2c - local_30) * *(float *)(local_10 + 0x6870);
  }
  this = (shared_data *)*local_8;
  bVar1 = *(byte *)(local_10 + 0x68c8);
  bVar6 = test_label(in_stack_fffffffffffffc98);
  shared_data::update(this,(bool)(bVar1 & 1),(bool)((bVar6 ^ 0xffU) & 1),local_1c,
                      *(float *)(local_10 + 0x6870),*(size_t *)(local_10 + 0x68a0));
  local_58 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar9 = v_array<int>::begin(local_58);
  local_60 = *ppiVar9;
  ppiVar9 = v_array<int>::end(local_58);
  local_68 = *ppiVar9;
  for (; local_60 != local_68; local_60 = local_60 + 1) {
    local_6c = *local_60;
    if (*(long *)(*local_8 + 0x70) == 0) {
      in_stack_fffffffffffffc88 = *(undefined8 *)(local_10 + 0x6878);
      in_stack_fffffffffffffc90 = *(namedlabels **)(local_10 + 0x6880);
      in_stack_fffffffffffffc98 = *(multi_ex **)(local_10 + 0x6888);
      local_78 = *(undefined8 *)(local_10 + 0x6890);
      local_90 = in_stack_fffffffffffffc88;
      local_88 = in_stack_fffffffffffffc90;
      local_80 = in_stack_fffffffffffffc98;
      (*(code *)local_8[0x6a7])((float)*(uint *)(local_10 + 0x6850),0,local_6c);
    }
    else {
      local_a0 = namedlabels::get(in_stack_fffffffffffffc90,
                                  (uint32_t)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      iVar5 = local_6c;
      pcVar2 = (code *)local_8[0x6a8];
      pcVar4 = local_a0.begin;
      uVar10 = (long)local_a0.end - (long)local_a0.begin;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar4,uVar10,&local_c1);
      in_stack_fffffffffffffc88 = *(undefined8 *)(local_10 + 0x6878);
      in_stack_fffffffffffffc90 = *(namedlabels **)(local_10 + 0x6880);
      in_stack_fffffffffffffc98 = *(multi_ex **)(local_10 + 0x6888);
      in_stack_ffffffffffffff20 = *(example **)(local_10 + 0x6890);
      local_f8 = in_stack_fffffffffffffc88;
      in_stack_ffffffffffffff10 = in_stack_fffffffffffffc90;
      in_stack_ffffffffffffff18 = in_stack_fffffffffffffc98;
      (*pcVar2)(iVar5,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  if (0 < (int)local_8[0x6a6]) {
    std::__cxx11::stringstream::stringstream(local_280);
    local_284 = 0;
    while( true ) {
      uVar10 = (ulong)local_284;
      sVar11 = v_array<COST_SENSITIVE::wclass>::size(local_18);
      if (sVar11 <= uVar10) break;
      pwVar12 = v_array<COST_SENSITIVE::wclass>::operator[](local_18,(ulong)local_284);
      local_294._0_4_ = pwVar12->x;
      local_294._4_4_ = pwVar12->class_index;
      local_28c._0_4_ = pwVar12->partial_prediction;
      local_28c._4_4_ = pwVar12->wap_value;
      if (local_284 != 0) {
        std::operator<<(&local_270,' ');
      }
      poVar8 = (ostream *)std::ostream::operator<<(&local_270,local_294._4_4_);
      poVar8 = std::operator<<(poVar8,':');
      std::ostream::operator<<(poVar8,(float)local_28c);
      local_284 = local_284 + 1;
    }
    pcVar2 = (code *)local_8[0x6a8];
    lVar3 = local_8[0x6a6];
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffc98 = *(multi_ex **)(local_10 + 0x6888);
    (*pcVar2)((int)lVar3,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::stringstream::~stringstream(local_280);
  }
  test_label(in_stack_fffffffffffffc98);
  print_update(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
               (uint32_t)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  label& ld = ec.l.cs;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    size_t pred = (size_t)ec.pred.multiclass;

    float chosen_loss = FLT_MAX;
    float min = FLT_MAX;
    for (auto& cl : ld.costs)
    {
      if (cl.class_index == pred)
        chosen_loss = cl.x;
      if (cl.x < min)
        min = cl.x;
    }
    if (chosen_loss == FLT_MAX)
      cerr << "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?" << endl;

    loss = (chosen_loss - min) * ec.weight;
    // TODO(alberto): add option somewhere to allow using absolute loss instead?
    // loss = chosen_loss;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      wclass cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.class_index << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, test_label(&ec.l.cs), ec, nullptr, false, ec.pred.multiclass);
}